

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Array.h
# Opt level: O2

size_t __thiscall
axl::sl::Array<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>::
insert(Array<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_> *this,
      size_t index,ValueArg e,size_t count)

{
  size_t sVar1;
  Ret *pRVar2;
  Ret *pRVar3;
  
  if (count != 0) {
    pRVar2 = insertSpace(this,index,count);
    if (pRVar2 == (Ret *)0x0) {
      return 0xffffffffffffffff;
    }
    pRVar3 = pRVar2 + count;
    for (; pRVar2 < pRVar3; pRVar2 = pRVar2 + 1) {
      sVar1 = e->m_originalRet;
      pRVar2->m_context = e->m_context;
      pRVar2->m_originalRet = sVar1;
    }
  }
  return (this->
         super_ArrayRef<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>
         ).m_count;
}

Assistant:

size_t
	insert(
		size_t index,
		ValueArg e,
		size_t count = 1
	) {
		if (count == 0)
			return this->m_count;

		T* dst = insertSpace(index, count);
		if (!dst)
			return -1;

		T* end = dst + count;
		for (; dst < end; dst++)
			*dst = e;

		return this->m_count;
	}